

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O0

void Io_WriteVerilog(Abc_Ntk_t *pNtk,char *pFileName,int fOnlyAnds)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Ntk_t *pNtk_00;
  int local_34;
  int i;
  FILE *pFile;
  Abc_Ntk_t *pNetlist;
  int fOnlyAnds_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsAigNetlist(pNtk);
  if ((iVar2 == 0) && (iVar2 = Abc_NtkIsMappedNetlist(pNtk), iVar2 == 0)) {
    printf("Io_WriteVerilog(): Can produce Verilog for mapped or AIG netlists only.\n");
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Io_WriteVerilog(): Cannot open the output file \"%s\".\n",pFileName);
    }
    else {
      pcVar1 = pNtk->pName;
      pcVar3 = Extra_TimeStamp();
      fprintf(__stream,"// Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
      fprintf(__stream,"\n");
      if (pNtk->pDesign == (Abc_Des_t *)0x0) {
        Io_WriteVerilogInt((FILE *)__stream,pNtk,fOnlyAnds);
      }
      else {
        Io_WriteVerilogInt((FILE *)__stream,pNtk,fOnlyAnds);
        for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->pDesign->vModules), local_34 < iVar2;
            local_34 = local_34 + 1) {
          pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vModules,local_34);
          iVar2 = Abc_NtkIsNetlist(pNtk_00);
          if (iVar2 == 0) {
            __assert_fail("Abc_NtkIsNetlist(pNetlist)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteVerilog.c"
                          ,0x58,"void Io_WriteVerilog(Abc_Ntk_t *, char *, int)");
          }
          if (pNtk_00 != pNtk) {
            fprintf(__stream,"\n");
            Io_WriteVerilogInt((FILE *)__stream,pNtk_00,fOnlyAnds);
          }
        }
      }
      fprintf(__stream,"\n");
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void Io_WriteVerilog( Abc_Ntk_t * pNtk, char * pFileName, int fOnlyAnds )
{
    Abc_Ntk_t * pNetlist;
    FILE * pFile;
    int i;
    // can only write nodes represented using local AIGs
    if ( !Abc_NtkIsAigNetlist(pNtk) && !Abc_NtkIsMappedNetlist(pNtk) )
    {
        printf( "Io_WriteVerilog(): Can produce Verilog for mapped or AIG netlists only.\n" );
        return;
    }
    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteVerilog(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // write the equations for the network
    fprintf( pFile, "// Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    fprintf( pFile, "\n" );

    // write modules
    if ( pNtk->pDesign )
    {
        // write the network first
        Io_WriteVerilogInt( pFile, pNtk, fOnlyAnds );
        // write other things
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNetlist, i )
        {
            assert( Abc_NtkIsNetlist(pNetlist) );
            if ( pNetlist == pNtk )
                continue;
            fprintf( pFile, "\n" );
            Io_WriteVerilogInt( pFile, pNetlist, fOnlyAnds );
        }
    }
    else
    {
        Io_WriteVerilogInt( pFile, pNtk, fOnlyAnds );
    }

    fprintf( pFile, "\n" );
    fclose( pFile );
}